

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O1

CURLcode get_server_message(SASL *sasl,Curl_easy *data,bufref *out)

{
  CURLcode CVar1;
  size_t msglen;
  uchar *msg;
  char *serverdata;
  size_t local_28;
  uchar *local_20;
  char *local_18;
  
  local_18 = (char *)0x0;
  (*sasl->params->getmessage)((data->state).buffer,&local_18);
  if (local_18 == (char *)0x0) {
    CVar1 = CURLE_BAD_CONTENT_ENCODING;
  }
  else if ((*local_18 == '=') || (*local_18 == '\0')) {
    CVar1 = CURLE_OK;
    Curl_bufref_set(out,(void *)0x0,0,(_func_void_void_ptr *)0x0);
  }
  else {
    CVar1 = Curl_base64_decode(local_18,&local_20,&local_28);
    if (CVar1 == CURLE_OK) {
      Curl_bufref_set(out,local_20,local_28,curl_free);
      CVar1 = CURLE_OK;
    }
  }
  return CVar1;
}

Assistant:

static CURLcode get_server_message(struct SASL *sasl, struct Curl_easy *data,
                                   struct bufref *out)
{
  unsigned char *msg;
  size_t msglen;
  char *serverdata = NULL;
  CURLcode result = CURLE_OK;

  sasl->params->getmessage(data->state.buffer, &serverdata);
  if(!serverdata)
    result = CURLE_BAD_CONTENT_ENCODING;
  else if(!*serverdata || *serverdata == '=')
    Curl_bufref_set(out, NULL, 0, NULL);
  else {
    result = Curl_base64_decode(serverdata, &msg, &msglen);
    if(!result)
      Curl_bufref_set(out, msg, msglen, curl_free);
  }
  return result;
}